

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O2

int __thiscall ncnn::Pooling3D::load_param(Pooling3D *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->pooling_type = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar1;
  iVar1 = ParamDict::get(pd,0xb,iVar1);
  this->kernel_h = iVar1;
  iVar1 = ParamDict::get(pd,0x15,this->kernel_w);
  this->kernel_d = iVar1;
  iVar1 = ParamDict::get(pd,2,1);
  this->stride_w = iVar1;
  iVar1 = ParamDict::get(pd,0xc,iVar1);
  this->stride_h = iVar1;
  iVar1 = ParamDict::get(pd,0x16,this->stride_w);
  this->stride_d = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->pad_left = iVar1;
  iVar1 = ParamDict::get(pd,0xe,iVar1);
  this->pad_right = iVar1;
  iVar1 = ParamDict::get(pd,0xd,this->pad_left);
  this->pad_top = iVar1;
  iVar1 = ParamDict::get(pd,0xf,iVar1);
  this->pad_bottom = iVar1;
  iVar1 = ParamDict::get(pd,0x17,this->pad_top);
  this->pad_front = iVar1;
  iVar1 = ParamDict::get(pd,0x10,iVar1);
  this->pad_behind = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->global_pooling = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->pad_mode = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->avgpool_count_include_pad = iVar1;
  iVar1 = ParamDict::get(pd,7,0);
  this->adaptive_pooling = iVar1;
  iVar1 = ParamDict::get(pd,8,0);
  this->out_w = iVar1;
  iVar1 = ParamDict::get(pd,0x12,iVar1);
  this->out_h = iVar1;
  iVar1 = ParamDict::get(pd,0x1c,this->out_w);
  this->out_d = iVar1;
  return 0;
}

Assistant:

int Pooling3D::load_param(const ParamDict& pd)
{
    pooling_type = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    kernel_d = pd.get(21, kernel_w);
    stride_w = pd.get(2, 1);
    stride_h = pd.get(12, stride_w);
    stride_d = pd.get(22, stride_w);
    pad_left = pd.get(3, 0);
    pad_right = pd.get(14, pad_left);
    pad_top = pd.get(13, pad_left);
    pad_bottom = pd.get(15, pad_top);
    pad_front = pd.get(23, pad_top);
    pad_behind = pd.get(16, pad_front);
    global_pooling = pd.get(4, 0);
    pad_mode = pd.get(5, 0);
    avgpool_count_include_pad = pd.get(6, 0);
    adaptive_pooling = pd.get(7, 0);
    out_w = pd.get(8, 0);
    out_h = pd.get(18, out_w);
    out_d = pd.get(28, out_w);

    return 0;
}